

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_quadrature.hpp
# Opt level: O1

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::
  quadrature_traits<IntegratorXX::ProductQuadrature<IntegratorXX::detail::spherical_combine_op<double>,_IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::Womersley<double>_>,_void>
  ::generate(tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,
            Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
            *q1,Quadrature<IntegratorXX::Womersley<double>_> *q2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  pointer paVar5;
  _Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
  *p_Var6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  weight_container weights;
  point_container points;
  allocator_type local_81;
  vector<double,_std::allocator<double>_> local_80;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> local_68;
  pointer local_50;
  pointer local_48;
  _Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
  *local_40;
  pointer local_38;
  
  local_38 = (q1->
             super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
             ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  pdVar4 = (q1->
           super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar8 = (long)pdVar4 - (long)local_38 >> 3;
  local_50 = (q2->
             super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             ).points_.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_48 = (q2->
             super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             ).points_.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  lVar13 = ((long)local_48 - (long)local_50 >> 3) * -0x5555555555555555;
  local_40 = (_Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__;
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (&local_68,lVar13 * lVar8,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::vector(&local_80,lVar13 * lVar8,&local_81);
  p_Var6 = local_40;
  if (local_48 != local_50) {
    lVar7 = 2;
    lVar9 = 0;
    lVar10 = 0;
    do {
      if (pdVar4 != local_38) {
        lVar12 = 0;
        lVar11 = lVar7;
        do {
          paVar5 = (q2->
                   super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                   ).points_.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar1 = (q1->
                  super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                  ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12];
          dVar2 = *(double *)((long)(paVar5 + lVar10) + 8);
          dVar3 = *(double *)((long)(paVar5 + lVar10) + 0x10);
          (local_68.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar11 + -2] =
               paVar5[lVar10]._M_elems[0] * dVar1;
          (local_68.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar11 + -1] = dVar2 * dVar1;
          (local_68.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar11] = dVar1 * dVar3;
          *(double *)
           ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar12 * 8 + lVar9) =
               (q1->
               super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
               ).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12] *
               (q2->
               super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
               ).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + 3;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar12);
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + lVar8 * 8;
      lVar7 = lVar7 + lVar8 * 3;
    } while (lVar10 != lVar13 + (ulong)(lVar13 == 0));
  }
  std::
  _Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&,void>
            (local_40,&local_68,&local_80);
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
          *)p_Var6;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( const Quadrature<Quad1>& q1, const Quadrature<Quad2>& q2 ) {

    const auto npts1 = q1.npts();
    const auto npts2 = q2.npts();

    const auto npts = npts1 * npts2;
    point_container  points( npts );
    weight_container weights( npts );
    
    const auto& points1  = q1.points();
    const auto& weights1 = q1.weights();
    const auto& points2  = q2.points();
    const auto& weights2 = q2.weights();

    CombineOp op;

    for( size_t j = 0; j < npts2; ++j ) 
    for( size_t i = 0; i < npts1; ++i ) {

      const auto ij = i + j*npts1;
      points[ij]  = op(points1[i],  points2[j] );
      weights[ij] = op(weights1[i], weights2[j]);

    }

    return std::make_tuple( points, weights );
  }